

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedMS<tcu::Vector<unsigned_int,_4>,_4>::Run
          (AdvancedMS<tcu::Vector<unsigned_int,_4>,_4> *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLint level;
  GLuint texture;
  int in_ESI;
  GLuint unit;
  GLboolean layered;
  GLint layer;
  int i;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  GLenum *pGVar5;
  GLenum GVar6;
  ImageSizeMachine machine;
  ivec4 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  bVar1 = ShaderImageSizeBase::SupportedSamples(&this->super_ShaderImageSizeBase,in_ESI);
  lVar4 = 0x10;
  if (bVar1) {
    this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    pGVar5 = &DAT_01ae3340;
    uVar3 = 0;
    do {
      GVar6 = *pGVar5;
      glu::CallLogWrapper::glBindTexture(this_00,GVar6,this->m_texture[uVar3]);
      uVar2 = (uint)uVar3;
      if (uVar2 < 2) {
        glu::CallLogWrapper::glTexParameteri(this_00,GVar6,0x2801,0x2600);
        glu::CallLogWrapper::glTexParameteri(this_00,GVar6,0x2800,0x2600);
        switch(uVar3 & 0xffffffff) {
        case 0:
          glu::CallLogWrapper::glTexImage1D(this_00,GVar6,0,0x8d70,7,0,0x8d99,0x1405,(void *)0x0);
          glu::CallLogWrapper::glTexImage1D(this_00,GVar6,1,0x8d70,3,0,0x8d99,0x1405,(void *)0x0);
          glu::CallLogWrapper::glTexImage1D(this_00,GVar6,2,0x8d70,1,0,0x8d99,0x1405,(void *)0x0);
          texture = this->m_texture[uVar3];
          unit = 1;
          level = 1;
          layered = '\0';
          break;
        case 1:
          glu::CallLogWrapper::glTexImage2D
                    (this_00,GVar6,0,0x8d70,7,0xf,0,0x8d99,0x1405,(void *)0x0);
          texture = this->m_texture[uVar3];
          unit = 2;
LAB_00a32964:
          level = 0;
          layered = '\x01';
          break;
        default:
          goto switchD_00a327e6_default;
        }
        layer = 0;
        GVar6 = 35000;
LAB_00a32979:
        glu::CallLogWrapper::glBindImageTexture
                  (this_00,unit,texture,level,layered,layer,GVar6,0x8d70);
      }
      else {
        if (uVar2 == 2) {
          glu::CallLogWrapper::glTexImage3DMultisample(this_00,GVar6,4,0x8d70,7,9,3,'\0');
          texture = this->m_texture[uVar3];
          unit = 3;
          level = 0;
          layered = '\0';
          layer = 1;
          GVar6 = 0x88ba;
          goto LAB_00a32979;
        }
        if (uVar2 == 3) {
          glu::CallLogWrapper::glTexImage3DMultisample(this_00,GVar6,4,0x8d70,0x40,0x20,5,'\0');
          texture = this->m_texture[uVar3];
          unit = 4;
          goto LAB_00a32964;
        }
      }
switchD_00a327e6_default:
      uVar3 = uVar3 + 1;
      pGVar5 = pGVar5 + 1;
    } while (uVar3 != 4);
    ImageSizeMachine::ImageSizeMachine(&machine);
    local_a8.m_data[0] = 3;
    local_a8.m_data[1] = 0;
    local_a8.m_data[2] = 0;
    local_a8.m_data[3] = 0;
    local_98 = 0xf00000007;
    uStack_90 = 0;
    local_88 = 0x900000007;
    uStack_80 = 0;
    local_78 = 0x2000000040;
    local_70 = 5;
    local_6c = 0;
    uStack_64 = 0;
    local_5c = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    lVar4 = gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<unsigned_int,4>>
                      ((ImageSizeMachine *)&machine,4,true,&local_a8,true);
    ImageSizeMachine::~ImageSizeMachine(&machine);
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 5))
			return NOT_SUPPORTED;
		if (!SupportedSamples(4))
			return NOT_SUPPORTED;

		const GLenum target[4] = { GL_TEXTURE_1D, GL_TEXTURE_1D_ARRAY, GL_TEXTURE_2D_MULTISAMPLE_ARRAY,
								   GL_TEXTURE_2D_MULTISAMPLE_ARRAY };
		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] == GL_TEXTURE_1D || target[i] == GL_TEXTURE_1D_ARRAY)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexImage1D(target[i], 0, TexInternalFormat<T>(), 7, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage1D(target[i], 1, TexInternalFormat<T>(), 3, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage1D(target[i], 2, TexInternalFormat<T>(), 1, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(1, m_texture[i], 1, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexImage2D(target[i], 0, TexInternalFormat<T>(), 7, 15, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexImage3DMultisample(target[i], 4, TexInternalFormat<T>(), 7, 9, 3, GL_FALSE);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 1, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexImage3DMultisample(target[i], 4, TexInternalFormat<T>(), 64, 32, 5, GL_FALSE);
				glBindImageTexture(4, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[7] = { ivec4(3, 0, 0, 0), ivec4(7, 15, 0, 0), ivec4(7, 9, 0, 0), ivec4(64, 32, 5, 0),
						 ivec4(0),			ivec4(0),			ivec4(0) };
		return machine.Run<T>(STAGE, true, res, true);
	}